

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Ptr_t * Acb_GenerateSignalNames2(Vec_Wec_t *vGates,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p;
  Vec_Str_t *p_00;
  char *pcVar5;
  Vec_Int_t *p_01;
  void *pvVar6;
  Vec_Int_t *vGate;
  int nWires;
  int i;
  Vec_Str_t *vStr;
  char *pName;
  Vec_Ptr_t *vRes;
  int nNodes;
  int nOuts;
  int nIns;
  Vec_Ptr_t *vOuts_local;
  Vec_Ptr_t *vIns_local;
  Vec_Wec_t *vGates_local;
  
  iVar1 = Vec_PtrSize(vIns);
  iVar2 = Vec_PtrSize(vOuts);
  iVar3 = Vec_WecSize(vGates);
  iVar2 = (iVar3 - iVar1) - iVar2;
  iVar3 = Vec_WecSize(vGates);
  p = Vec_PtrStart(iVar3);
  p_00 = Vec_StrAlloc(1000);
  for (vGate._4_4_ = 0; iVar3 = Vec_PtrSize(vIns), vGate._4_4_ < iVar3;
      vGate._4_4_ = vGate._4_4_ + 1) {
    pcVar5 = (char *)Vec_PtrEntry(vIns,vGate._4_4_);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrWriteEntry(p,vGate._4_4_,pcVar5);
  }
  vGate._4_4_ = 0;
  while( true ) {
    iVar4 = Vec_PtrSize(vOuts);
    iVar3 = iVar1;
    if (iVar4 <= vGate._4_4_) {
      while (vGate._4_4_ = iVar3, vGate._4_4_ < iVar1 + iVar2) {
        pvVar6 = Vec_PtrEntry(p,vGate._4_4_);
        if (pvVar6 == (void *)0x0) {
          Vec_StrPrintF(p_00,"ww%d");
          Vec_StrPush(p_00,'\0');
          pcVar5 = Vec_StrReleaseArray(p_00);
          Vec_PtrWriteEntry(p,vGate._4_4_,pcVar5);
        }
        iVar3 = vGate._4_4_ + 1;
      }
      Vec_StrFree(p_00);
      return p;
    }
    pcVar5 = (char *)Vec_PtrEntry(vOuts,vGate._4_4_);
    p_01 = Vec_WecEntry(vGates,iVar1 + iVar2 + vGate._4_4_);
    iVar3 = Vec_IntEntry(p_01,0);
    if (iVar3 != 0xb) break;
    iVar3 = Vec_IntEntry(p_01,1);
    pcVar5 = Abc_UtilStrsav(pcVar5);
    Vec_PtrWriteEntry(p,iVar3,pcVar5);
    vGate._4_4_ = vGate._4_4_ + 1;
  }
  __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                ,0x837,"Vec_Ptr_t *Acb_GenerateSignalNames2(Vec_Wec_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
  ;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames2( Vec_Wec_t * vGates, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts);
    int nNodes = Vec_WecSize(vGates) - nIns - nOuts;
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_WecSize(vGates) ); char * pName;
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, nWires = 1;
    // create input names
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(pName) );
    // create names for nodes driving outputs
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, nIns + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(pName) );
    }
    for ( i = nIns; i < nIns + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}